

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MenuBar.h
# Opt level: O1

void __thiscall gui::MenuBarStyle::MenuBarStyle(MenuBarStyle *this,MenuBarStyle *param_1)

{
  Font *pFVar1;
  Uint64 UVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  Color CVar9;
  Color CVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  Uint32 UVar18;
  uint uVar19;
  bool bVar20;
  undefined7 uVar21;
  Color CVar22;
  
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__Style_001e6d18;
  (this->super_Style).gui_ = (param_1->super_Style).gui_;
  (this->super_Style)._vptr_Style = (_func_int **)&PTR__MenuBarStyle_001e76f0;
  (this->bar_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001e66b0;
  (this->bar_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Transformable_001e8418;
  memcpy(&(this->bar_).super_Shape.super_Transformable.m_origin,
         &(param_1->bar_).super_Shape.super_Transformable.m_origin,0xa1);
  (this->bar_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8448;
  (this->bar_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Shape_001e8480;
  iVar5 = (param_1->bar_).super_Shape.m_textureRect.left;
  iVar6 = (param_1->bar_).super_Shape.m_textureRect.top;
  iVar7 = (param_1->bar_).super_Shape.m_textureRect.width;
  iVar8 = (param_1->bar_).super_Shape.m_textureRect.height;
  CVar9 = (param_1->bar_).super_Shape.m_fillColor;
  CVar10 = (param_1->bar_).super_Shape.m_outlineColor;
  (this->bar_).super_Shape.m_texture = (param_1->bar_).super_Shape.m_texture;
  (this->bar_).super_Shape.m_textureRect.left = iVar5;
  (this->bar_).super_Shape.m_textureRect.top = iVar6;
  (this->bar_).super_Shape.m_textureRect.width = iVar7;
  (this->bar_).super_Shape.m_textureRect.height = iVar8;
  (this->bar_).super_Shape.m_fillColor = CVar9;
  (this->bar_).super_Shape.m_outlineColor = CVar10;
  (this->bar_).super_Shape.m_outlineThickness = (param_1->bar_).super_Shape.m_outlineThickness;
  (this->bar_).super_Shape.m_vertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->bar_).super_Shape.m_vertices.m_vertices,
             &(param_1->bar_).super_Shape.m_vertices.m_vertices);
  (this->bar_).super_Shape.m_vertices.m_primitiveType =
       (param_1->bar_).super_Shape.m_vertices.m_primitiveType;
  (this->bar_).super_Shape.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->bar_).super_Shape.m_outlineVertices.m_vertices,
             &(param_1->bar_).super_Shape.m_outlineVertices.m_vertices);
  (this->bar_).super_Shape.m_outlineVertices.m_primitiveType =
       (param_1->bar_).super_Shape.m_outlineVertices.m_primitiveType;
  fVar11 = (param_1->bar_).super_Shape.m_insideBounds.top;
  fVar12 = (param_1->bar_).super_Shape.m_insideBounds.width;
  fVar13 = (param_1->bar_).super_Shape.m_insideBounds.height;
  fVar14 = (param_1->bar_).super_Shape.m_bounds.left;
  fVar15 = (param_1->bar_).super_Shape.m_bounds.top;
  fVar16 = (param_1->bar_).super_Shape.m_bounds.width;
  fVar17 = (param_1->bar_).super_Shape.m_bounds.height;
  (this->bar_).super_Shape.m_insideBounds.left = (param_1->bar_).super_Shape.m_insideBounds.left;
  (this->bar_).super_Shape.m_insideBounds.top = fVar11;
  (this->bar_).super_Shape.m_insideBounds.width = fVar12;
  (this->bar_).super_Shape.m_insideBounds.height = fVar13;
  (this->bar_).super_Shape.m_bounds.left = fVar14;
  (this->bar_).super_Shape.m_bounds.top = fVar15;
  (this->bar_).super_Shape.m_bounds.width = fVar16;
  (this->bar_).super_Shape.m_bounds.height = fVar17;
  (this->bar_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8548;
  (this->bar_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__RectangleShape_001e8580;
  (this->bar_).m_size = (param_1->bar_).m_size;
  (this->menu_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001e66b0;
  (this->menu_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Transformable_001e8418;
  memcpy(&(this->menu_).super_Shape.super_Transformable.m_origin,
         &(param_1->menu_).super_Shape.super_Transformable.m_origin,0xa1);
  (this->menu_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8448;
  (this->menu_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Shape_001e8480;
  iVar5 = (param_1->menu_).super_Shape.m_textureRect.left;
  iVar6 = (param_1->menu_).super_Shape.m_textureRect.top;
  iVar7 = (param_1->menu_).super_Shape.m_textureRect.width;
  iVar8 = (param_1->menu_).super_Shape.m_textureRect.height;
  CVar9 = (param_1->menu_).super_Shape.m_fillColor;
  CVar10 = (param_1->menu_).super_Shape.m_outlineColor;
  (this->menu_).super_Shape.m_texture = (param_1->menu_).super_Shape.m_texture;
  (this->menu_).super_Shape.m_textureRect.left = iVar5;
  (this->menu_).super_Shape.m_textureRect.top = iVar6;
  (this->menu_).super_Shape.m_textureRect.width = iVar7;
  (this->menu_).super_Shape.m_textureRect.height = iVar8;
  (this->menu_).super_Shape.m_fillColor = CVar9;
  (this->menu_).super_Shape.m_outlineColor = CVar10;
  (this->menu_).super_Shape.m_outlineThickness = (param_1->menu_).super_Shape.m_outlineThickness;
  (this->menu_).super_Shape.m_vertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->menu_).super_Shape.m_vertices.m_vertices,
             &(param_1->menu_).super_Shape.m_vertices.m_vertices);
  (this->menu_).super_Shape.m_vertices.m_primitiveType =
       (param_1->menu_).super_Shape.m_vertices.m_primitiveType;
  (this->menu_).super_Shape.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->menu_).super_Shape.m_outlineVertices.m_vertices,
             &(param_1->menu_).super_Shape.m_outlineVertices.m_vertices);
  (this->menu_).super_Shape.m_outlineVertices.m_primitiveType =
       (param_1->menu_).super_Shape.m_outlineVertices.m_primitiveType;
  fVar11 = (param_1->menu_).super_Shape.m_insideBounds.top;
  fVar12 = (param_1->menu_).super_Shape.m_insideBounds.width;
  fVar13 = (param_1->menu_).super_Shape.m_insideBounds.height;
  fVar14 = (param_1->menu_).super_Shape.m_bounds.left;
  fVar15 = (param_1->menu_).super_Shape.m_bounds.top;
  fVar16 = (param_1->menu_).super_Shape.m_bounds.width;
  fVar17 = (param_1->menu_).super_Shape.m_bounds.height;
  (this->menu_).super_Shape.m_insideBounds.left = (param_1->menu_).super_Shape.m_insideBounds.left;
  (this->menu_).super_Shape.m_insideBounds.top = fVar11;
  (this->menu_).super_Shape.m_insideBounds.width = fVar12;
  (this->menu_).super_Shape.m_insideBounds.height = fVar13;
  (this->menu_).super_Shape.m_bounds.left = fVar14;
  (this->menu_).super_Shape.m_bounds.top = fVar15;
  (this->menu_).super_Shape.m_bounds.width = fVar16;
  (this->menu_).super_Shape.m_bounds.height = fVar17;
  (this->menu_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8548;
  (this->menu_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__RectangleShape_001e8580;
  (this->menu_).m_size = (param_1->menu_).m_size;
  (this->highlight_).super_Shape.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__Drawable_001e66b0;
  (this->highlight_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Transformable_001e8418;
  memcpy(&(this->highlight_).super_Shape.super_Transformable.m_origin,
         &(param_1->highlight_).super_Shape.super_Transformable.m_origin,0xa1);
  (this->highlight_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8448;
  (this->highlight_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__Shape_001e8480;
  iVar5 = (param_1->highlight_).super_Shape.m_textureRect.left;
  iVar6 = (param_1->highlight_).super_Shape.m_textureRect.top;
  iVar7 = (param_1->highlight_).super_Shape.m_textureRect.width;
  iVar8 = (param_1->highlight_).super_Shape.m_textureRect.height;
  CVar9 = (param_1->highlight_).super_Shape.m_fillColor;
  CVar10 = (param_1->highlight_).super_Shape.m_outlineColor;
  (this->highlight_).super_Shape.m_texture = (param_1->highlight_).super_Shape.m_texture;
  (this->highlight_).super_Shape.m_textureRect.left = iVar5;
  (this->highlight_).super_Shape.m_textureRect.top = iVar6;
  (this->highlight_).super_Shape.m_textureRect.width = iVar7;
  (this->highlight_).super_Shape.m_textureRect.height = iVar8;
  (this->highlight_).super_Shape.m_fillColor = CVar9;
  (this->highlight_).super_Shape.m_outlineColor = CVar10;
  (this->highlight_).super_Shape.m_outlineThickness =
       (param_1->highlight_).super_Shape.m_outlineThickness;
  (this->highlight_).super_Shape.m_vertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->highlight_).super_Shape.m_vertices.m_vertices,
             &(param_1->highlight_).super_Shape.m_vertices.m_vertices);
  (this->highlight_).super_Shape.m_vertices.m_primitiveType =
       (param_1->highlight_).super_Shape.m_vertices.m_primitiveType;
  (this->highlight_).super_Shape.m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->highlight_).super_Shape.m_outlineVertices.m_vertices,
             &(param_1->highlight_).super_Shape.m_outlineVertices.m_vertices);
  (this->highlight_).super_Shape.m_outlineVertices.m_primitiveType =
       (param_1->highlight_).super_Shape.m_outlineVertices.m_primitiveType;
  fVar11 = (param_1->highlight_).super_Shape.m_insideBounds.top;
  fVar12 = (param_1->highlight_).super_Shape.m_insideBounds.width;
  fVar13 = (param_1->highlight_).super_Shape.m_insideBounds.height;
  fVar14 = (param_1->highlight_).super_Shape.m_bounds.left;
  fVar15 = (param_1->highlight_).super_Shape.m_bounds.top;
  fVar16 = (param_1->highlight_).super_Shape.m_bounds.width;
  fVar17 = (param_1->highlight_).super_Shape.m_bounds.height;
  (this->highlight_).super_Shape.m_insideBounds.left =
       (param_1->highlight_).super_Shape.m_insideBounds.left;
  (this->highlight_).super_Shape.m_insideBounds.top = fVar11;
  (this->highlight_).super_Shape.m_insideBounds.width = fVar12;
  (this->highlight_).super_Shape.m_insideBounds.height = fVar13;
  (this->highlight_).super_Shape.m_bounds.left = fVar14;
  (this->highlight_).super_Shape.m_bounds.top = fVar15;
  (this->highlight_).super_Shape.m_bounds.width = fVar16;
  (this->highlight_).super_Shape.m_bounds.height = fVar17;
  (this->highlight_).super_Shape.super_Drawable._vptr_Drawable = (_func_int **)&PTR__Shape_001e8548;
  (this->highlight_).super_Shape.super_Transformable._vptr_Transformable =
       (_func_int **)&PTR__RectangleShape_001e8580;
  (this->highlight_).m_size = (param_1->highlight_).m_size;
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Drawable_001e66b0;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Transformable_001e8418
  ;
  memcpy(&(this->text_).super_Transformable.m_origin,&(param_1->text_).super_Transformable.m_origin,
         0xa1);
  (this->text_).super_Drawable._vptr_Drawable = (_func_int **)&PTR__Text_001e8638;
  (this->text_).super_Transformable._vptr_Transformable = (_func_int **)&PTR__Text_001e8660;
  sf::String::String(&(this->text_).m_string,&(param_1->text_).m_string);
  (this->text_).m_outlineThickness = (param_1->text_).m_outlineThickness;
  pFVar1 = (param_1->text_).m_font;
  uVar19 = (param_1->text_).m_characterSize;
  fVar11 = (param_1->text_).m_letterSpacingFactor;
  UVar18 = (param_1->text_).m_style;
  CVar9 = (param_1->text_).m_fillColor;
  CVar10 = (param_1->text_).m_outlineColor;
  (this->text_).m_lineSpacingFactor = (param_1->text_).m_lineSpacingFactor;
  (this->text_).m_style = UVar18;
  (this->text_).m_fillColor = CVar9;
  (this->text_).m_outlineColor = CVar10;
  (this->text_).m_font = pFVar1;
  (this->text_).m_characterSize = uVar19;
  (this->text_).m_letterSpacingFactor = fVar11;
  (this->text_).m_vertices.super_Drawable._vptr_Drawable = (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->text_).m_vertices.m_vertices,&(param_1->text_).m_vertices.m_vertices);
  (this->text_).m_vertices.m_primitiveType = (param_1->text_).m_vertices.m_primitiveType;
  (this->text_).m_outlineVertices.super_Drawable._vptr_Drawable =
       (_func_int **)&PTR__VertexArray_001e86b8;
  std::vector<sf::Vertex,_std::allocator<sf::Vertex>_>::vector
            (&(this->text_).m_outlineVertices.m_vertices,
             &(param_1->text_).m_outlineVertices.m_vertices);
  (this->text_).m_outlineVertices.m_primitiveType =
       (param_1->text_).m_outlineVertices.m_primitiveType;
  fVar11 = (param_1->text_).m_bounds.top;
  fVar12 = (param_1->text_).m_bounds.width;
  fVar13 = (param_1->text_).m_bounds.height;
  bVar20 = (param_1->text_).m_geometryNeedUpdate;
  uVar21 = *(undefined7 *)&(param_1->text_).field_0x161;
  UVar2 = (param_1->text_).m_fontTextureId;
  (this->text_).m_bounds.left = (param_1->text_).m_bounds.left;
  (this->text_).m_bounds.top = fVar11;
  (this->text_).m_bounds.width = fVar12;
  (this->text_).m_bounds.height = fVar13;
  (this->text_).m_geometryNeedUpdate = bVar20;
  *(undefined7 *)&(this->text_).field_0x161 = uVar21;
  (this->text_).m_fontTextureId = UVar2;
  CVar9 = param_1->disabledTextColor_;
  CVar10 = param_1->highlightColor_;
  CVar22 = param_1->disabledHighlightColor_;
  fVar11 = (param_1->barTextPadding_).x;
  fVar12 = (param_1->barTextPadding_).y;
  uVar3 = *(undefined8 *)&(param_1->barTextPadding_).z;
  fVar13 = (param_1->menuTextPadding_).x;
  fVar14 = (param_1->menuTextPadding_).y;
  uVar4 = *(undefined8 *)&(param_1->menuTextPadding_).z;
  this->textColor_ = param_1->textColor_;
  this->disabledTextColor_ = CVar9;
  this->highlightColor_ = CVar10;
  this->disabledHighlightColor_ = CVar22;
  (this->barTextPadding_).x = fVar11;
  (this->barTextPadding_).y = fVar12;
  *(undefined8 *)&(this->barTextPadding_).z = uVar3;
  (this->menuTextPadding_).x = fVar13;
  (this->menuTextPadding_).y = fVar14;
  *(undefined8 *)&(this->menuTextPadding_).z = uVar4;
  return;
}

Assistant:

virtual ~MenuBarStyle() = default;